

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_combine.h
# Opt level: O2

size_t spvtools::utils::hash_combine<unsigned_int>
                 (size_t hash,vector<unsigned_int,_std::allocator<unsigned_int>_> *vals)

{
  uint *val;
  uint *puVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  
  for (puVar1 = (vals->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      puVar1 != (vals->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish; puVar1 = puVar1 + 1) {
    hash = hash ^ (hash >> 2) + hash * 0x40 + 0x9e3779b9 + (ulong)*puVar1;
  }
  return hash;
}

Assistant:

inline size_t hash_combine(std::size_t hash, const std::vector<T>& vals) {
  for (const T& val : vals) {
    hash = hash_combine(hash, val);
  }
  return hash;
}